

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Triangulated_Surface.h
# Opt level: O1

void __thiscall
Nova::Triangulated_Surface<double>::Triangulated_Surface
          (Triangulated_Surface<double> *this,Array<Nova::Vector<double,_3,_true>_> *points_input,
          Array<Nova::Vector<int,_3,_true>_> *elements_input)

{
  std::vector<Nova::Vector<double,_3,_true>,_std::allocator<Nova::Vector<double,_3,_true>_>_>::
  vector((vector<Nova::Vector<double,_3,_true>,_std::allocator<Nova::Vector<double,_3,_true>_>_> *)
         this,&points_input->_data);
  (this->super_Simplex_Mesh<3>).number_of_nodes =
       ((long)(points_input->_data).
              super__Vector_base<Nova::Vector<double,_3,_true>,_std::allocator<Nova::Vector<double,_3,_true>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)(points_input->_data).
              super__Vector_base<Nova::Vector<double,_3,_true>,_std::allocator<Nova::Vector<double,_3,_true>_>_>
              ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
  std::vector<Nova::Vector<int,_3,_true>,_std::allocator<Nova::Vector<int,_3,_true>_>_>::vector
            (&(this->super_Simplex_Mesh<3>).elements._data,&elements_input->_data);
  (this->super_Simplex_Mesh<3>).incident_elements = (Array<Nova::Array<int>_> *)0x0;
  (this->super_Simplex_Mesh<3>).neighbor_nodes = (Array<Nova::Array<int>_> *)0x0;
  (this->super_Simplex_Mesh<3>).adjacent_elements = (Array<Nova::Array<int>_> *)0x0;
  return;
}

Assistant:

Triangulated_Surface(const Array<TV>& points_input,const Array<INDEX>& elements_input)
        :Point_Base(points_input),Mesh_Base(points_input.size(),elements_input)
    {}